

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuPrivate::hideMenu(QMenuPrivate *this,QMenu *menu)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  QWidget *this_00;
  QMenu *pQVar4;
  QWidget *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QAction *activeAction;
  bool signalsBlocked;
  QEventLoop eventLoop;
  QPointer<QMenu> stillAlive;
  Reposter deleteDeleteLate;
  undefined4 in_stack_ffffffffffffff48;
  ProcessEventsFlag in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  bool local_99;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_40;
  undefined1 *local_38;
  QWidget *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QWidget *)0x0) goto LAB_00641148;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = in_RSI;
  QPointer<QMenu>::QPointer<void>
            ((QPointer<QMenu> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (QMenu *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QObject::signalsBlocked((QObject *)0x640ddd);
  QObject::blockSignals(SUB81(local_30,0));
  *(ushort *)(in_RDI + 0x420) = *(ushort *)(in_RDI + 0x420) & 0xfeff | 0x100;
  bVar2 = false;
  local_99 = false;
  if (local_30 != (QWidget *)0x0) {
    this_00 = (QWidget *)
              QWidget::style((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    pQVar4 = ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x640e4b);
    iVar3 = (**(code **)(*(long *)this_00 + 0xf0))(this_00,0x51,0,pQVar4);
    local_99 = false;
    if ((iVar3 != 0) && (local_99 = false, *(long *)(in_RDI + 0x288) != 0)) {
      bVar1 = ::operator==((QAction **)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                           ,(QPointer<QAction> *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_99 = false;
      if (bVar1) {
        QWidget::actions(this_00);
        bVar2 = true;
        local_99 = QListSpecialMethodsBase<QAction*>::contains<QAction*>
                             ((QListSpecialMethodsBase<QAction_*> *)
                              CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                              (QAction **)
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
    }
  }
  if (bVar2) {
    QList<QAction_*>::~QList((QList<QAction_*> *)0x640f01);
  }
  if ((local_99 & 1U) == 0) {
LAB_00641060:
    *(ushort *)(in_RDI + 0x420) = *(ushort *)(in_RDI + 0x420) & 0xfeff;
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x641086);
    if (bVar2) {
      QObject::blockSignals(SUB81(local_30,0));
      bVar2 = ::operator==((QPointer<QMenu> *)CONCAT17(local_99,in_stack_ffffffffffffff50),
                           (QMenu **)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (bVar2) {
        QPointer<QMenu>::operator=
                  ((QPointer<QMenu> *)CONCAT17(local_99,in_stack_ffffffffffffff50),
                   (QMenu *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
      QMenu::d_func((QMenu *)0x6410f2);
      iVar3 = 0;
      QPointer<QAction>::operator=
                ((QPointer<QAction> *)CONCAT17(local_99,in_stack_ffffffffffffff50),
                 (QAction *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QWidget::close(local_30,iVar3);
      QMenu::d_func((QMenu *)0x641123);
      QPointer<QWidget>::operator=
                ((QPointer<QWidget> *)CONCAT17(local_99,in_stack_ffffffffffffff50),
                 (QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
  }
  else {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    QEventLoop::QEventLoop((QEventLoop *)&local_68,(QObject *)0x0);
    QMenu::setActiveAction
              ((QMenu *)CONCAT17(local_99,in_stack_ffffffffffffff50),
               (QAction *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    hideMenu::Reposter::Reposter
              ((Reposter *)CONCAT17(local_99,in_stack_ffffffffffffff50),
               (QMenu *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QTimer::singleShot((int)((ulong)in_RDI >> 0x20),
                       (QObject *)CONCAT17(local_99,in_stack_ffffffffffffff50),
                       (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)CONCAT17(local_99,in_stack_ffffffffffffff50)
               ,in_stack_ffffffffffffff4c);
    QEventLoop::exec((QFlags_conflict1 *)&local_68);
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x640fe1);
    if (bVar2) {
      QMenu::setActiveAction
                ((QMenu *)CONCAT17(local_99,in_stack_ffffffffffffff50),
                 (QAction *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QTimer::singleShot((int)((ulong)in_RDI >> 0x20),
                         (QObject *)CONCAT17(local_99,in_stack_ffffffffffffff50),
                         (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QFlags<QEventLoop::ProcessEventsFlag>::QFlags
                ((QFlags<QEventLoop::ProcessEventsFlag> *)
                 CONCAT17(local_99,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c);
      QEventLoop::exec((QFlags_conflict1 *)&local_68);
    }
    hideMenu::Reposter::~Reposter((Reposter *)CONCAT17(local_99,in_stack_ffffffffffffff50));
    QEventLoop::~QEventLoop((QEventLoop *)&local_68);
    if (bVar2) goto LAB_00641060;
  }
  QPointer<QMenu>::~QPointer((QPointer<QMenu> *)0x641148);
LAB_00641148:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::hideMenu(QMenu *menu)
{
    if (!menu)
        return;

    // See two execs below. They may trigger an akward situation
    // when 'menu' (also known as 'q' or 'this' in the many functions
    // around) to become a dangling pointer if the loop manages
    // to execute 'deferred delete' ... posted while executing
    // this same loop. Not good!
    struct Reposter : QObject
    {
        Reposter(QMenu *menu) : q(menu)
        {
            Q_ASSERT(q);
            q->installEventFilter(this);
        }
        ~Reposter()
        {
            if (deleteLater)
                q->deleteLater();
        }
        bool eventFilter(QObject *obj, QEvent *event) override
        {
            if (obj == q && event->type() == QEvent::DeferredDelete)
                return deleteLater = true;

            return QObject::eventFilter(obj, event);
        }
        QMenu *q = nullptr;
        bool deleteLater = false;
    };

#if QT_CONFIG(effects)
    // If deleteLater has been called and the event loop spins, while waiting
    // for visual effects to happen, menu might become stale.
    // To prevent a QSignalBlocker from restoring a stale object, block and restore signals manually.
    QPointer<QMenu> stillAlive(menu);
    const bool signalsBlocked = menu->signalsBlocked();
    menu->blockSignals(true);

    aboutToHide = true;
    // Flash item which is about to trigger (if any).
    if (menu && menu->style()->styleHint(QStyle::SH_Menu_FlashTriggeredItem, nullptr, stillAlive)
        && currentAction && currentAction == actionAboutToTrigger
        && menu->actions().contains(currentAction)) {
        QEventLoop eventLoop;
        QAction *activeAction = currentAction;

        menu->setActiveAction(nullptr);
        const Reposter deleteDeleteLate(menu);
        QTimer::singleShot(60, &eventLoop, SLOT(quit()));
        eventLoop.exec();

        if (!stillAlive)
            return;

        // Select and wait 20 ms.
        menu->setActiveAction(activeAction);
        QTimer::singleShot(20, &eventLoop, SLOT(quit()));
        eventLoop.exec();
    }

    aboutToHide = false;

    if (stillAlive)
        menu->blockSignals(signalsBlocked);
    else
        return;

#endif // QT_CONFIG(effects)
    if (activeMenu == menu)
        activeMenu = nullptr;

    menu->d_func()->causedPopup.action = nullptr;
    menu->close();
    menu->d_func()->causedPopup.widget = nullptr;
}